

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

Status __thiscall leveldb::DBImpl::MakeRoomForWrite(DBImpl *this,bool force)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  uint64_t uVar4;
  MemTable *pMVar5;
  byte in_DL;
  long in_RSI;
  char *in_RDI;
  long in_FS_OFFSET;
  uint64_t new_log_number;
  bool allow_delay;
  Status *s;
  WritableFile *lfile;
  DBImpl *in_stack_ffffffffffffff18;
  Status *in_stack_ffffffffffffff20;
  VersionSet *in_stack_ffffffffffffff28;
  string *in_stack_ffffffffffffff30;
  Status *in_stack_ffffffffffffff38;
  InternalKeyComparator *comparator;
  MemTable *this_00;
  byte local_4a;
  byte local_49;
  undefined8 local_30;
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_49 = in_DL & 1;
  port::Mutex::AssertHeld((Mutex *)in_stack_ffffffffffffff18);
  bVar1 = std::deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>::empty
                    ((deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_> *
                     )in_stack_ffffffffffffff18);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!writers_.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/db_impl.cc"
                  ,0x52b,"Status leveldb::DBImpl::MakeRoomForWrite(bool)");
  }
  local_4a = (local_49 ^ 0xff) & 1;
  Status::Status((Status *)in_stack_ffffffffffffff18);
LAB_0189179b:
  do {
    bVar1 = Status::ok((Status *)in_stack_ffffffffffffff18);
    if (!bVar1) {
      Status::operator=(in_stack_ffffffffffffff38,(Status *)in_stack_ffffffffffffff30);
LAB_01891c21:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return (Status)in_RDI;
      }
      __stack_chk_fail();
    }
    if ((local_4a != 0) &&
       (iVar2 = VersionSet::NumLevelFiles
                          (in_stack_ffffffffffffff28,(int)((ulong)in_stack_ffffffffffffff20 >> 0x20)
                          ), 7 < iVar2)) {
      port::Mutex::Unlock((Mutex *)in_stack_ffffffffffffff18);
      (**(code **)(**(long **)(in_RSI + 8) + 0xa0))(*(long **)(in_RSI + 8),1000);
      local_4a = 0;
      port::Mutex::Lock((Mutex *)in_stack_ffffffffffffff18);
      goto LAB_0189179b;
    }
    if ((local_49 == 0) &&
       (sVar3 = MemTable::ApproximateMemoryUsage((MemTable *)in_stack_ffffffffffffff18),
       sVar3 <= *(ulong *)(in_RSI + 0x50))) goto LAB_01891c21;
    if (*(long *)(in_RSI + 0x138) == 0) {
      iVar2 = VersionSet::NumLevelFiles
                        (in_stack_ffffffffffffff28,(int)((ulong)in_stack_ffffffffffffff20 >> 0x20));
      if (iVar2 < 0xc) {
        uVar4 = VersionSet::PrevLogNumber((VersionSet *)in_stack_ffffffffffffff18);
        if (uVar4 != 0) {
          __assert_fail("versions_->PrevLogNumber() == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/db_impl.cc"
                        ,0x54e,"Status leveldb::DBImpl::MakeRoomForWrite(bool)");
        }
        pMVar5 = (MemTable *)VersionSet::NewFileNumber((VersionSet *)in_stack_ffffffffffffff18);
        local_30 = 0;
        comparator = *(InternalKeyComparator **)(in_RSI + 8);
        this_00 = pMVar5;
        LogFileName(in_stack_ffffffffffffff30,(uint64_t)in_stack_ffffffffffffff28);
        (*(comparator->super_Comparator)._vptr_Comparator[4])
                  (&stack0xffffffffffffffc8,comparator,local_28,&local_30);
        Status::operator=((Status *)in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
        Status::~Status((Status *)in_stack_ffffffffffffff18);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffff18);
        bVar1 = Status::ok((Status *)in_stack_ffffffffffffff18);
        if (!bVar1) {
          VersionSet::ReuseFileNumber(in_stack_ffffffffffffff28,(uint64_t)in_stack_ffffffffffffff20)
          ;
          goto LAB_01891c21;
        }
        in_stack_ffffffffffffff38 = *(Status **)(in_RSI + 0x158);
        if (in_stack_ffffffffffffff38 != (Status *)0x0) {
          log::Writer::~Writer((Writer *)in_stack_ffffffffffffff18);
          operator_delete(in_stack_ffffffffffffff38,0x20);
        }
        in_stack_ffffffffffffff30 = *(string **)(in_RSI + 0x148);
        if (in_stack_ffffffffffffff30 != (string *)0x0) {
          (**(code **)((in_stack_ffffffffffffff30->_M_dataplus)._M_p + 8))();
        }
        *(undefined8 *)(in_RSI + 0x148) = local_30;
        *(MemTable **)(in_RSI + 0x150) = pMVar5;
        in_stack_ffffffffffffff28 = (VersionSet *)operator_new(0x20);
        log::Writer::Writer((Writer *)in_stack_ffffffffffffff18,(WritableFile *)0x1891b30);
        *(VersionSet **)(in_RSI + 0x158) = in_stack_ffffffffffffff28;
        *(undefined8 *)(in_RSI + 0x138) = *(undefined8 *)(in_RSI + 0x130);
        std::atomic<bool>::store
                  ((atomic<bool> *)in_stack_ffffffffffffff30,
                   SUB81((ulong)in_stack_ffffffffffffff28 >> 0x38,0),
                   (memory_order)in_stack_ffffffffffffff28);
        in_stack_ffffffffffffff20 = (Status *)operator_new(0x70);
        MemTable::MemTable(this_00,comparator);
        *(Status **)(in_RSI + 0x130) = in_stack_ffffffffffffff20;
        MemTable::Ref((MemTable *)in_stack_ffffffffffffff18);
        local_49 = 0;
        MaybeScheduleCompaction(in_stack_ffffffffffffff18);
      }
      else {
        Log(*(Logger **)(in_RSI + 0x48),"Too many L0 files; waiting...\n");
        port::CondVar::Wait((CondVar *)in_stack_ffffffffffffff28);
      }
    }
    else {
      Log(*(Logger **)(in_RSI + 0x48),"Current memtable full; waiting...\n");
      port::CondVar::Wait((CondVar *)in_stack_ffffffffffffff28);
    }
  } while( true );
}

Assistant:

Status DBImpl::MakeRoomForWrite(bool force) {
  mutex_.AssertHeld();
  assert(!writers_.empty());
  bool allow_delay = !force;
  Status s;
  while (true) {
    if (!bg_error_.ok()) {
      // Yield previous error
      s = bg_error_;
      break;
    } else if (allow_delay && versions_->NumLevelFiles(0) >=
                                  config::kL0_SlowdownWritesTrigger) {
      // We are getting close to hitting a hard limit on the number of
      // L0 files.  Rather than delaying a single write by several
      // seconds when we hit the hard limit, start delaying each
      // individual write by 1ms to reduce latency variance.  Also,
      // this delay hands over some CPU to the compaction thread in
      // case it is sharing the same core as the writer.
      mutex_.Unlock();
      env_->SleepForMicroseconds(1000);
      allow_delay = false;  // Do not delay a single write more than once
      mutex_.Lock();
    } else if (!force &&
               (mem_->ApproximateMemoryUsage() <= options_.write_buffer_size)) {
      // There is room in current memtable
      break;
    } else if (imm_ != nullptr) {
      // We have filled up the current memtable, but the previous
      // one is still being compacted, so we wait.
      Log(options_.info_log, "Current memtable full; waiting...\n");
      background_work_finished_signal_.Wait();
    } else if (versions_->NumLevelFiles(0) >= config::kL0_StopWritesTrigger) {
      // There are too many level-0 files.
      Log(options_.info_log, "Too many L0 files; waiting...\n");
      background_work_finished_signal_.Wait();
    } else {
      // Attempt to switch to a new memtable and trigger compaction of old
      assert(versions_->PrevLogNumber() == 0);
      uint64_t new_log_number = versions_->NewFileNumber();
      WritableFile* lfile = nullptr;
      s = env_->NewWritableFile(LogFileName(dbname_, new_log_number), &lfile);
      if (!s.ok()) {
        // Avoid chewing through file number space in a tight loop.
        versions_->ReuseFileNumber(new_log_number);
        break;
      }
      delete log_;
      delete logfile_;
      logfile_ = lfile;
      logfile_number_ = new_log_number;
      log_ = new log::Writer(lfile);
      imm_ = mem_;
      has_imm_.store(true, std::memory_order_release);
      mem_ = new MemTable(internal_comparator_);
      mem_->Ref();
      force = false;  // Do not force another compaction if have room
      MaybeScheduleCompaction();
    }
  }
  return s;
}